

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall google::protobuf::Arena::AddBlockInternal(Arena *this,Block *b)

{
  Block *pBVar1;
  Block *b_local;
  Arena *this_local;
  
  pBVar1 = (Block *)internal::NoBarrier_Load((Atomic64 *)(this + 8));
  b->next = pBVar1;
  internal::Release_Store((Atomic64 *)(this + 8),(Atomic64)b);
  if (b->size != b->pos) {
    internal::Release_Store((Atomic64 *)(this + 0x10),(Atomic64)b);
  }
  *(size_t *)(this + 0x18) = b->size + *(long *)(this + 0x18);
  return;
}

Assistant:

void Arena::AddBlockInternal(Block* b) {
  b->next = reinterpret_cast<Block*>(google::protobuf::internal::NoBarrier_Load(&blocks_));
  google::protobuf::internal::Release_Store(&blocks_, reinterpret_cast<google::protobuf::internal::AtomicWord>(b));
  if (b->avail() != 0) {
    // Direct future allocations to this block.
    google::protobuf::internal::Release_Store(&hint_, reinterpret_cast<google::protobuf::internal::AtomicWord>(b));
  }
  space_allocated_ += b->size;
}